

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

bool __thiscall roaring::Roaring64Map::isSubset(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_header *p_Var1;
  _Bool _Var2;
  char cVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  bool bVar10;
  
  p_Var5 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  bVar10 = (_Rb_tree_header *)p_Var5 == p_Var8;
  if (!bVar10) {
    p_Var1 = &(r->roarings)._M_t._M_impl.super__Rb_tree_header;
    do {
      _Var2 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var5[1]._M_parent);
      cVar3 = '\x03';
      if (!_Var2) {
        p_Var6 = (r->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 = &p_Var1->_M_header;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            bVar9 = (_Rb_tree_color)*(size_t *)(p_Var6 + 1) < p_Var5[1]._M_color;
            if (!bVar9) {
              p_Var4 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[bVar9];
          } while (p_Var6 != (_Base_ptr)0x0);
        }
        p_Var7 = p_Var1;
        if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
           (p_Var7 = (_Rb_tree_header *)p_Var4,
           p_Var5[1]._M_color < (_Rb_tree_color)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
          p_Var7 = p_Var1;
        }
        if (p_Var7 == p_Var1) {
          cVar3 = '\x01';
        }
        else {
          _Var2 = roaring_bitmap_is_subset
                            ((roaring_bitmap_t *)&p_Var5[1]._M_parent,
                             (roaring_bitmap_t *)(p_Var7 + 1));
          cVar3 = !_Var2;
        }
      }
      if ((cVar3 != '\x03') && (cVar3 != '\0')) {
        return bVar10;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      bVar10 = (_Rb_tree_header *)p_Var5 == p_Var8;
    } while (!bVar10);
  }
  return bVar10;
}

Assistant:

bool isSubset(const Roaring64Map &r) const {
        for (const auto &map_entry : roarings) {
            if (map_entry.second.isEmpty()) {
                continue;
            }
            auto roaring_iter = r.roarings.find(map_entry.first);
            if (roaring_iter == r.roarings.cend())
                return false;
            else if (!map_entry.second.isSubset(roaring_iter->second))
                return false;
        }
        return true;
    }